

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O1

int big_block_flush(BigBlock *block)

{
  BigAttr *pBVar1;
  uint uVar2;
  BigAttrSet *pBVar3;
  byte *pbVar4;
  int iVar5;
  int iVar6;
  FILE *pFVar7;
  void *__ptr;
  ulong uVar8;
  char *__dest;
  size_t sVar9;
  byte *pbVar10;
  ulong uVar11;
  uint uVar12;
  char *pcVar13;
  BigAttr *pBVar14;
  long lVar15;
  ulong uVar16;
  char ndtype [8];
  byte local_b8 [136];
  
  if (block->dirty != 0) {
    pFVar7 = (FILE *)_big_file_open_a_file(block->basename,-1,"w+",1);
    if (pFVar7 == (FILE *)0x0) {
      _big_file_raise((char *)0x0,
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                      ,0x250);
      iVar5 = 2;
    }
    else {
      iVar5 = fprintf(pFVar7,"DTYPE: %s\n",block);
      if (((iVar5 < 0) ||
          (iVar5 = fprintf(pFVar7,"NMEMB: %d\n",(ulong)(uint)block->nmemb), iVar5 < 0)) ||
         (iVar5 = fprintf(pFVar7,"NFILE: %d\n",(ulong)(uint)block->Nfile), iVar5 < 0)) {
        _big_file_raise("Writing file header",
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                        ,0x256);
        iVar5 = 3;
      }
      else {
        if (0 < block->Nfile) {
          uVar11 = 0;
          do {
            uVar2 = block->fchecksum[uVar11];
            uVar12 = (uVar2 >> 0x10) + (uVar2 & 0xffff);
            iVar5 = fprintf(pFVar7,"%06X: %td : %u : %u\n",uVar11 & 0xffffffff,block->fsize[uVar11],
                            (ulong)uVar2,(ulong)((uVar12 >> 0x10) + (uVar12 & 0xffff)));
            if (iVar5 < 0) {
              _big_file_raise("Writing file information to header",
                              "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                              ,0x25c);
              iVar5 = 3;
              goto LAB_00107dd3;
            }
            uVar11 = uVar11 + 1;
          } while ((long)uVar11 < (long)block->Nfile);
        }
        fclose(pFVar7);
        block->dirty = 0;
        iVar5 = 0;
      }
    }
LAB_00107dd3:
    if (iVar5 == 3) {
      fclose(pFVar7);
      return -1;
    }
    if (iVar5 != 0) {
      return -1;
    }
  }
  pBVar3 = block->attrset;
  iVar5 = 0;
  if (pBVar3->dirty != 0) {
    pcVar13 = block->basename;
    pBVar3->dirty = 0;
    pFVar7 = (FILE *)_big_file_open_a_file(pcVar13,-3,"w",1);
    if (pFVar7 == (FILE *)0x0) {
      _big_file_raise((char *)0x0,
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                      ,0x621);
LAB_001080cc:
      _big_file_raise((char *)0x0,
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                      ,0x264);
      iVar5 = -1;
    }
    else {
      if (pBVar3->listused != 0) {
        uVar11 = 0;
        do {
          pBVar14 = pBVar3->attrlist;
          pBVar1 = pBVar14 + uVar11;
          pcVar13 = pBVar1->dtype;
          _dtype_normalize((char *)local_b8,pcVar13);
          iVar5 = atoi((char *)(local_b8 + 2));
          uVar16 = (long)pBVar1->nmemb * (long)iVar5;
          __ptr = malloc(uVar16 * 2 + 1);
          pbVar4 = (byte *)pBVar1->data;
          if ((int)uVar16 < 1) {
            uVar8 = 0;
          }
          else {
            uVar8 = 0;
            pbVar10 = pbVar4;
            do {
              *(char *)((long)__ptr + uVar8) = "0123456789ABCDEF"[*pbVar10 >> 4];
              *(char *)((long)__ptr + uVar8 + 1) = "0123456789ABCDEF"[*pbVar10 & 0xf];
              uVar8 = uVar8 + 2;
              pbVar10 = pbVar10 + 1;
            } while ((uVar16 & 0xffffffff) * 2 != uVar8);
            uVar8 = uVar8 & 0xffffffff;
          }
          pBVar14 = pBVar14 + uVar11;
          *(undefined1 *)((long)__ptr + uVar8) = 0;
          if ((int)uVar16 < 0x81) {
            __dest = (char *)malloc((long)pBVar14->nmemb * 0x20 + 1);
            *__dest = '\0';
            if (0 < pBVar14->nmemb) {
              lVar15 = 0;
              uVar16 = 0;
              do {
                if (pBVar14->dtype[1] == 'a') {
LAB_00107f81:
                  local_b8[0] = pbVar4[uVar16];
                  local_b8[1] = 0;
                  if (local_b8[0] == 0) break;
                  if (local_b8[0] == 10) {
                    sVar9 = strlen(__dest);
                    builtin_strncpy(__dest + sVar9,"...",4);
                    break;
                  }
                  strcat(__dest,(char *)local_b8);
                }
                else {
                  if (pBVar14->dtype[1] == 'S') {
                    _dtype_normalize((char *)local_b8,pcVar13);
                    iVar6 = atoi((char *)(local_b8 + 2));
                    if (iVar6 == 1) goto LAB_00107f81;
                  }
                  big_file_dtype_format((char *)local_b8,pcVar13,pbVar4 + lVar15,(char *)0x0);
                  strcat(__dest,(char *)local_b8);
                  if (uVar16 != pBVar14->nmemb - 1) {
                    sVar9 = strlen(__dest);
                    (__dest + sVar9)[0] = ' ';
                    (__dest + sVar9)[1] = '\0';
                  }
                }
                uVar16 = uVar16 + 1;
                lVar15 = lVar15 + iVar5;
              } while ((long)uVar16 < (long)pBVar14->nmemb);
            }
          }
          else {
            __dest = (char *)malloc(0x10);
            builtin_strncpy(__dest,"... (Too Long) ",0x10);
          }
          iVar5 = fprintf(pFVar7,"%s %s %d %s #HUMANE [ %s ]\n",pBVar14->name,pcVar13,
                          (ulong)(uint)pBVar14->nmemb,__ptr,__dest);
          free(__ptr);
          free(__dest);
          if (iVar5 < 1) {
            _big_file_raise("Failed to write to file",
                            "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                            ,0x656);
            fclose(pFVar7);
            goto LAB_001080cc;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < pBVar3->listused);
      }
      fclose(pFVar7);
      block->attrset->dirty = 0;
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int
big_block_flush(BigBlock * block)
{
    FILE * fheader = NULL;
    if(block->dirty) {
        int i;
        fheader = _big_file_open_a_file(block->basename, FILEID_HEADER, "w+", 1);
        RAISEIF(fheader == NULL, ex_fileio, NULL);
        RAISEIF(
            (0 > fprintf(fheader, "DTYPE: %s\n", block->dtype)) ||
            (0 > fprintf(fheader, "NMEMB: %d\n", block->nmemb)) ||
            (0 > fprintf(fheader, "NFILE: %d\n", block->Nfile)),
                ex_fprintf,
                "Writing file header");
        for(i = 0; i < block->Nfile; i ++) {
            unsigned int s = block->fchecksum[i];
            unsigned int r = (s & 0xffff) + ((s & 0xffffffff) >> 16);
            unsigned int checksum = (r & 0xffff) + (r >> 16);
            RAISEIF(0 > fprintf(fheader, EXT_DATA ": %td : %u : %u\n", i, block->fsize[i], block->fchecksum[i], checksum),
                ex_fprintf, "Writing file information to header");
        }
        fclose(fheader);
        block->dirty = 0;
    }
    if(block->attrset->dirty) {
        RAISEIF(0 != attrset_write_attr_set_v2(block->attrset, block->basename),
            ex_write_attr,
            NULL);
        block->attrset->dirty = 0;
    }
    return 0;

ex_fprintf:
    fclose(fheader);
ex_write_attr:
ex_fileio:
    return -1;
}